

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
wasm::anon_unknown_0::MinimizeRecGroups::getCanonicalPermutation
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MinimizeRecGroups *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  pointer *__k;
  iterator iVar1;
  _Hash_node_base *__args;
  undefined8 *puVar2;
  _Base_ptr p_Var3;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  __first;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  __last;
  pointer pHVar4;
  iterator __position;
  const_iterator cVar5;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *pvVar6;
  ulong uVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  iterator iVar11;
  _Rb_tree_color *__args_00;
  long lVar12;
  size_type __n;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  __i;
  pointer pvVar13;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  __last_00;
  undefined8 *puVar14;
  undefined1 auVar15 [8];
  pointer pHVar16;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar17;
  undefined1 local_1b0 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  typeSet;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  undefined1 local_140 [8];
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  indexInLeastOrder;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  dfsOrders;
  value_type curr;
  map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  typeClasses;
  HeapType type;
  undefined1 auStack_a8 [8];
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  indexInFinalOrder;
  undefined1 auStack_68 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> finalOrder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *permutation;
  
  std::
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_1b0,
             (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish,0,local_140,auStack_a8,&curr);
  std::
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ::vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
            *)&indexInLeastOrder._M_h._M_single_bucket,
           (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_140);
  lVar12 = (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    __n = lVar12 >> 3;
    __k = &dfsOrders.
           super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar7 = 0;
    do {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 (indexInLeastOrder._M_h._M_single_bucket + uVar7 * 3),__n);
      auStack_a8 = (undefined1  [8])0x0;
      indexInFinalOrder._M_h._M_buckets = (__buckets_ptr)0x0;
      indexInFinalOrder._M_h._M_bucket_count = 0;
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      _M_realloc_insert<wasm::HeapType_const&>
                ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)auStack_a8,(iterator)0x0,
                 (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start + uVar7);
      local_140 = (undefined1  [8])&indexInLeastOrder._M_h._M_rehash_policy._M_next_resize;
      indexInLeastOrder._M_h._M_buckets = (__buckets_ptr)0x1;
      indexInLeastOrder._M_h._M_bucket_count = 0;
      indexInLeastOrder._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      indexInLeastOrder._M_h._M_element_count._0_4_ = 0x3f800000;
      indexInLeastOrder._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      indexInLeastOrder._M_h._M_rehash_policy._4_4_ = 0;
      indexInLeastOrder._M_h._M_rehash_policy._M_next_resize = 0;
      if (auStack_a8 != (undefined1  [8])indexInFinalOrder._M_h._M_buckets) {
        do {
          dfsOrders.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)indexInFinalOrder._M_h._M_buckets[-1];
          indexInFinalOrder._M_h._M_buckets = indexInFinalOrder._M_h._M_buckets + -1;
          cVar5 = std::
                  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_1b0,(key_type *)__k);
          if ((cVar5.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0)
             && (curr.id = (uintptr_t)local_140,
                pVar17 = std::
                         _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         ::
                         _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                                   ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                     *)local_140,__k,&curr),
                ((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
            pvVar6 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                     (indexInLeastOrder._M_h._M_single_bucket + uVar7 * 3);
            iVar1._M_current = *(HeapType **)(pvVar6 + 8);
            if (iVar1._M_current == *(HeapType **)(pvVar6 + 0x10)) {
              std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
              _M_realloc_insert<wasm::HeapType_const&>(pvVar6,iVar1,(HeapType *)__k);
            }
            else {
              (iVar1._M_current)->id =
                   (uintptr_t)
                   dfsOrders.
                   super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(HeapType **)(pvVar6 + 8) = iVar1._M_current + 1;
            }
            HeapType::getReferencedHeapTypes
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&curr,
                       (HeapType *)__k);
            typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count = curr.id;
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_range_insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)auStack_a8,
                       indexInFinalOrder._M_h._M_buckets,auStack_68,
                       &typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if (curr.id != 0) {
              operator_delete((void *)curr.id,
                              typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                              curr.id);
            }
          }
        } while (auStack_a8 != (undefined1  [8])indexInFinalOrder._M_h._M_buckets);
      }
      if ((long)indexInLeastOrder._M_h._M_single_bucket[uVar7 * 3 + 1]._M_nxt -
          (long)indexInLeastOrder._M_h._M_single_bucket[uVar7 * 3]._M_nxt !=
          (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
                .super__Vector_impl_data._M_start) {
        __assert_fail("dfsOrders[i].size() == types.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x2ee,
                      "std::vector<Index> wasm::(anonymous namespace)::MinimizeRecGroups::getCanonicalPermutation(const std::vector<HeapType> &)"
                     );
      }
      std::
      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_140);
      if (auStack_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_a8,indexInFinalOrder._M_h._M_bucket_count - (long)auStack_a8
                       );
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      __n = (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    } while (uVar7 < __n);
  }
  typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&typeClasses;
  typeClasses._M_t._M_impl._0_4_ = 0;
  typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((pointer)indexInLeastOrder._M_h._M_single_bucket !=
      dfsOrders.
      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pvVar13 = (pointer)indexInLeastOrder._M_h._M_single_bucket;
    do {
      local_168._8_8_ = 0;
      pcStack_150 = std::
                    _Function_handler<bool_(wasm::HeapType,_wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:757:44)>
                    ::_M_invoke;
      local_158 = std::
                  _Function_handler<bool_(wasm::HeapType,_wasm::HeapType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:757:44)>
                  ::_M_manager;
      local_168._M_unused._M_object = this;
      local_140 = (undefined1  [8])pvVar13;
      std::function<bool_(wasm::HeapType,_wasm::HeapType)>::function
                ((function<bool_(wasm::HeapType,_wasm::HeapType)> *)&indexInLeastOrder,
                 (function<bool_(wasm::HeapType,_wasm::HeapType)> *)&local_168);
      if (local_158 != (code *)0x0) {
        (*local_158)(&local_168,&local_168,__destroy_functor);
      }
      pvVar6 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
               std::
               map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               ::operator[]((map<wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                             *)&curr,(key_type *)local_140);
      __args = (_Hash_node_base *)
               (pvVar13->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar1._M_current = *(HeapType **)(pvVar6 + 8);
      if (iVar1._M_current == *(HeapType **)(pvVar6 + 0x10)) {
        std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
        _M_realloc_insert<wasm::HeapType_const&>(pvVar6,iVar1,(HeapType *)__args);
      }
      else {
        (iVar1._M_current)->id = (uintptr_t)__args->_M_nxt;
        *(HeapType **)(pvVar6 + 8) = iVar1._M_current + 1;
      }
      if (indexInLeastOrder._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        (*(code *)indexInLeastOrder._M_h._M_before_begin._M_nxt)
                  ((function<bool_(wasm::HeapType,_wasm::HeapType)> *)&indexInLeastOrder,
                   (function<bool_(wasm::HeapType,_wasm::HeapType)> *)&indexInLeastOrder,3);
      }
      pvVar13 = pvVar13 + 1;
    } while (pvVar13 !=
             dfsOrders.
             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  local_140 = (undefined1  [8])&indexInLeastOrder._M_h._M_rehash_policy._M_next_resize;
  indexInLeastOrder._M_h._M_buckets = (__buckets_ptr)0x1;
  indexInLeastOrder._M_h._M_bucket_count = 0;
  indexInLeastOrder._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indexInLeastOrder._M_h._M_element_count._0_4_ = 0x3f800000;
  indexInLeastOrder._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  indexInLeastOrder._M_h._M_rehash_policy._4_4_ = 0;
  indexInLeastOrder._M_h._M_rehash_policy._M_next_resize = 0;
  puVar14 = (undefined8 *)
            **(long **)(typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1);
  puVar2 = (undefined8 *)
           (*(long **)(typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1))[1];
  if (puVar14 != puVar2) {
    do {
      auStack_a8 = (undefined1  [8])*puVar14;
      indexInFinalOrder._M_h._M_buckets =
           (__buckets_ptr)
           CONCAT44(indexInFinalOrder._M_h._M_buckets._4_4_,
                    indexInLeastOrder._M_h._M_before_begin._M_nxt._0_4_);
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_140,auStack_a8);
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar2);
  }
  typeSet._M_h._M_single_bucket =
       (__node_base_ptr)
       typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[2]._M_parent;
  p_Var3 = typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[2]._M_left;
  uVar7 = (long)p_Var3 - (long)typeSet._M_h._M_single_bucket >> 3;
  if (typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&typeClasses)
  {
    p_Var9 = typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      __first._M_current = (HeapType *)p_Var9[2]._M_parent;
      __last._M_current = (HeapType *)p_Var9[2]._M_left;
      uVar8 = (long)__last._M_current - (long)__first._M_current >> 3;
      if (uVar8 != uVar7) {
        __assert_fail("members.size() == classSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x313,
                      "std::vector<Index> wasm::(anonymous namespace)::MinimizeRecGroups::getCanonicalPermutation(const std::vector<HeapType> &)"
                     );
      }
      if (__first._M_current != __last._M_current) {
        lVar12 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>>
                  (__first,__last,(ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_passes_MinimizeRecGroups_cpp:788:49)>
                    )local_140);
        if ((long)__last._M_current - (long)__first._M_current < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>>
                    (__first,__last,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_passes_MinimizeRecGroups_cpp:788:49)>
                      )local_140);
        }
        else {
          __last_00._M_current = __first._M_current + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>>
                    (__first,__last_00,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_passes_MinimizeRecGroups_cpp:788:49)>
                      )local_140);
          for (; __last_00._M_current != __last._M_current;
              __last_00._M_current = __last_00._M_current + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,__gnu_cxx::__ops::_Val_comp_iter<wasm::(anonymous_namespace)::MinimizeRecGroups::getCanonicalPermutation(std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>const&)::_lambda(wasm::HeapType,wasm::HeapType)_2_>>
                      (__last_00,
                       (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_passes_MinimizeRecGroups_cpp:788:49)>
                        )local_140);
          }
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != (_Rb_tree_node_base *)&typeClasses);
  }
  auStack_68 = (undefined1  [8])0x0;
  finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_68,
             (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  if (p_Var3 != (_Base_ptr)typeSet._M_h._M_single_bucket) {
    uVar8 = 0;
    p_Var10 = typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      for (; p_Var10 != (_Rb_tree_node_base *)&typeClasses;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        __args_00 = &(p_Var10[2]._M_parent)->_M_color + uVar8 * 2;
        if (finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)auStack_68,
                     (iterator)
                     finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start,(HeapType *)__args_00);
        }
        else {
          (finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start)->id = *(uintptr_t *)__args_00;
          finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start =
               finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      p_Var10 = typeClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while (uVar8 < uVar7);
  }
  pHVar16 = finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  auStack_a8 = (undefined1  [8])&indexInFinalOrder._M_h._M_rehash_policy._M_next_resize;
  indexInFinalOrder._M_h._M_buckets = (__buckets_ptr)0x1;
  indexInFinalOrder._M_h._M_bucket_count = 0;
  indexInFinalOrder._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indexInFinalOrder._M_h._M_element_count._0_4_ = 0x3f800000;
  indexInFinalOrder._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  indexInFinalOrder._M_h._M_rehash_policy._4_4_ = 0;
  indexInFinalOrder._M_h._M_rehash_policy._M_next_resize = 0;
  if (auStack_68 !=
      (undefined1  [8])
      finalOrder.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar15 = auStack_68;
    do {
      typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count = ((pointer)auVar15)->id;
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)auStack_a8,&typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
      auVar15 = (undefined1  [8])((long)auVar15 + 8);
    } while (auVar15 != (undefined1  [8])pHVar16);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (__return_storage_ptr__,
             (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  pHVar16 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pHVar4 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar16 != pHVar4) {
    do {
      typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count = pHVar16->id;
      iVar11 = std::
               _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)auStack_a8,
                      (key_type *)&typeClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (iVar11.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
          _M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,
                   (uint *)((long)iVar11.
                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                  ._M_cur + 0x10));
      }
      else {
        *__position._M_current =
             *(uint *)((long)iVar11.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                             ._M_cur + 0x10);
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pHVar16 = pHVar16 + 1;
    } while (pHVar16 != pHVar4);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_a8);
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)finalOrder.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  std::
  _Rb_tree<wasm::ComparableRecGroupShape,_std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::ComparableRecGroupShape,_std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::ComparableRecGroupShape>,_std::allocator<std::pair<const_wasm::ComparableRecGroupShape,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
               *)&curr);
  std::
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             *)&indexInLeastOrder._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index>
  getCanonicalPermutation(const std::vector<HeapType>& types) {
    // The correctness of this part depends on some interesting properties of
    // strongly connected graphs with ordered, directed edges. A permutation of
    // the vertices in a graph is an isomorphism that produces an isomorphic
    // graph. An automorphism is an isomorphism of a structure onto itself, so
    // an automorphism of a graph is a permutation of the vertices that does not
    // change the label-independent properties of a graph. Permutations can be
    // described in terms of sets of cycles of elements.
    //
    // As an example, consider this strongly-connected recursion group:
    //
    //     (rec
    //       (type $a1 (struct (field (ref $a2) (ref $b1))))
    //       (type $a2 (struct (field (ref $a1) (ref $b2))))
    //       (type $b1 (struct (field (ref $b2) (ref $a1))))
    //       (type $b2 (struct (field (ref $b1) (ref $a2))))
    //     )
    //
    // This group has one nontrivial automorphism: ($a1 $a2) ($b1 $b2). Applying
    // this automorphism gives this recursion group:
    //
    //     (rec
    //       (type $a2 (struct (field (ref $a1) (ref $b2))))
    //       (type $a1 (struct (field (ref $a2) (ref $b1))))
    //       (type $b2 (struct (field (ref $b1) (ref $a2))))
    //       (type $b1 (struct (field (ref $b2) (ref $a1))))
    //     )
    //
    // We can verify that the permutation was an automorphism by checking that
    // the label-independent properties of these two rec groups are the same.
    // Indeed, when we write the adjacency matrices with ordered edges for the
    // two graphs, they both come out to this:
    //
    //     0: _ 0 1 _
    //     1: 0 _ _ 1
    //     2: 1 _ _ 0
    //     3: _ 1 0 _
    //
    // In addition to having the same adjacency matrix, the two recursion groups
    // have the same vertex colorings since all of their types have the same
    // top-level structure. Since the label-independent properties of the
    // recursion groups (i.e. all the properties except the intended type
    // identity at each index) are the same, the permutation that takes one
    // group to the other is an automorphism. These are precisely the
    // permutations that do not change a recursion group's shape, so would not
    // change type identity under WebAssembly's isorecursive type system. In
    // other words, automorphisms cannot help us resolve shape conflicts, so we
    // want to avoid generating them.
    //
    // Theorem 1: All cycles in an automorphism of a strongly-connected
    // recursion group are the same size.
    //
    //     Proof: By contradiction. Assume there are two cycles of different
    //     sizes. Because the group is strongly connected, there is a path from
    //     an element in the smaller of these cycles to an element in the
    //     larger. This path must contain an edge between two vertices in cycles
    //     of different sizes N and M such that N < M. Apply the automorphism N
    //     times. The source of this edge has been cycled back to its original
    //     index, but the destination is not yet back at its original index, so
    //     the edge's destination index is different from its original
    //     destination index and the permutation we applied was not an
    //     automorphism after all.
    //
    // Corollary 1.1: No nontrivial automorphism of an SCC may have a stationary
    // element, since either all the cycles have size 1 and the automorphism is
    // trivial or all the cycles have some other size and there are no
    // stationary elements.
    //
    // Corollary 1.2: No two distinct permutations of an SCC with the same first
    // element (e.g. both with some type $t as the first element) have the same
    // shape, since no nontrivial automorphism can keep the first element
    // stationary while mapping one permutation to the other.
    //
    // Find a canonical ordering of the types in this group. The ordering must
    // be independent of the initial order of the types. To do so, consider the
    // orderings given by visitation order on a tree search rooted at each type
    // in the group. Since the group is strongly connected, a tree search from
    // any of types will visit all types in the group, so it will generate a
    // total and deterministic ordering of the types in the group. We can
    // compare the shapes of each of these orderings to organize the root
    // types and their generated orderings into ordered equivalence classes.
    // These equivalence classes each correspond to a cycle in an automorphism
    // of the graph because their elements are vertices that can all occupy the
    // initial index of the graph without the graph structure changing. We can
    // choose an arbitrary ordering from the least equivalence class as a
    // canonical ordering because all orderings in that class describe the same
    // label-independent graph.
    //
    // Compute the orderings generated by DFS on each type.
    std::unordered_set<HeapType> typeSet(types.begin(), types.end());
    std::vector<std::vector<HeapType>> dfsOrders(types.size());
    for (Index i = 0; i < types.size(); ++i) {
      dfsOrders[i].reserve(types.size());
      std::vector<HeapType> workList;
      workList.push_back(types[i]);
      std::unordered_set<HeapType> seen;
      while (!workList.empty()) {
        auto curr = workList.back();
        workList.pop_back();
        if (!typeSet.count(curr)) {
          continue;
        }
        if (seen.insert(curr).second) {
          dfsOrders[i].push_back(curr);
          auto children = curr.getReferencedHeapTypes();
          workList.insert(workList.end(), children.rbegin(), children.rend());
        }
      }
      assert(dfsOrders[i].size() == types.size());
    }

    // Organize the orderings into equivalence classes, mapping equivalent
    // shapes to lists of automorphically equivalent root types.
    std::map<ComparableRecGroupShape, std::vector<HeapType>> typeClasses;
    for (const auto& order : dfsOrders) {
      ComparableRecGroupShape shape(order, [this](HeapType a, HeapType b) {
        return this->typeIndices.at(a) < this->typeIndices.at(b);
      });
      typeClasses[shape].push_back(order[0]);
    }

    // Choose the initial canonical ordering.
    const auto& leastOrder = typeClasses.begin()->first.types;

    // We want our canonical ordering to have the additional property that it
    // contains one type from each equivalence class before a second type of any
    // equivalence class. Since our utility for enumerating the topological
    // sorts of the canonical order keeps the initial element fixed as long as
    // possible before moving to the next one, by Corollary 1.2 and because
    // permutations that begin with types in different equivalence class cannot
    // have the same shape (otherwise those initial types would be in the same
    // equivalence class), this will maximize the number of distinct shapes the
    // utility emits before starting to emit permutations that have the same
    // shapes as previous permutations. Since all the type equivalence classes
    // are the same size by Theorem 1, we can assemble the final order by
    // striping across the equivalence classes. We determine the order of types
    // taken from each equivalence class by sorting them by order of appearance
    // in the least order, which ensures the final order remains independent of
    // the initial order.
    std::unordered_map<HeapType, Index> indexInLeastOrder;
    for (auto type : leastOrder) {
      indexInLeastOrder.insert({type, indexInLeastOrder.size()});
    }
    auto classSize = typeClasses.begin()->second.size();
    for (auto& [shape, members] : typeClasses) {
      assert(members.size() == classSize);
      std::sort(members.begin(), members.end(), [&](HeapType a, HeapType b) {
        return indexInLeastOrder.at(a) < indexInLeastOrder.at(b);
      });
    }
    std::vector<HeapType> finalOrder;
    finalOrder.reserve(types.size());
    for (Index i = 0; i < classSize; ++i) {
      for (auto& [shape, members] : typeClasses) {
        finalOrder.push_back(members[i]);
      }
    }

    // Now what we actually want is the permutation that takes us from the final
    // canonical order to the original order of the types.
    std::unordered_map<HeapType, Index> indexInFinalOrder;
    for (auto type : finalOrder) {
      indexInFinalOrder.insert({type, indexInFinalOrder.size()});
    }
    std::vector<Index> permutation;
    permutation.reserve(types.size());
    for (auto type : types) {
      permutation.push_back(indexInFinalOrder.at(type));
    }
    return permutation;
  }